

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  Layer *pLVar4;
  Option *pOVar5;
  undefined8 *in_RSI;
  ParamDict *in_RDI;
  Mat int8_weight_data;
  ParamDict pd;
  bool weight_data_is_float32;
  bool weight_data_is_int8;
  int in_stack_fffffffffffff93c;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  Mat *in_stack_fffffffffffff948;
  Mat *this_00;
  ParamDict *this_01;
  Mat local_658;
  ParamDict local_620;
  byte local_10a;
  undefined1 local_109;
  Mat local_108;
  Mat local_d0;
  undefined1 local_98 [72];
  undefined1 local_50 [56];
  undefined8 *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)*in_RSI)(local_50,in_RSI,(int)in_RDI->params[1].v.cstep,0);
  Mat::operator=(in_stack_fffffffffffff948,
                 (Mat *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
  Mat::~Mat((Mat *)0x11cbee);
  bVar2 = Mat::empty((Mat *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
  if (bVar2) {
    local_4 = -100;
  }
  else {
    if (in_RDI->params[1].v.c != 0) {
      (**(code **)*local_18)(local_98,local_18,in_RDI->params[1].v.h,1);
      Mat::operator=(in_stack_fffffffffffff948,
                     (Mat *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
      Mat::~Mat((Mat *)0x11cc9f);
      bVar2 = Mat::empty((Mat *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
      if (bVar2) {
        return -100;
      }
    }
    if (*(int *)((long)&in_RDI->params[1].v.cstep + 4) != 0) {
      (**(code **)*local_18)(&local_d0,local_18,1);
      pfVar3 = Mat::operator[](&local_d0,0);
      in_RDI->params[3].v.h = (int)*pfVar3;
      Mat::~Mat((Mat *)0x11cd5a);
      (**(code **)*local_18)(&local_108,local_18,1);
      pfVar3 = Mat::operator[](&local_108,0);
      in_RDI->params[3].v.c = (int)*pfVar3;
      Mat::~Mat((Mat *)0x11cdb4);
    }
    local_109 = in_RDI->params[2].v.refcount == (int *)0x1;
    local_10a = in_RDI->params[2].v.refcount == (int *)0x4;
    if (((bool)local_109) && ((in_RDI->params[3].v.cstep & 1) == 0)) {
      fprintf(_stderr,"quantized int8 weight loaded but use_int8_inference disabled\n");
      local_4 = -1;
    }
    else {
      if ((in_RDI->params[3].v.cstep & 1) != 0) {
        pLVar4 = create_layer(in_stack_fffffffffffff93c);
        *(Layer **)(in_RDI->params + 4) = pLVar4;
        pLVar4 = create_layer(in_stack_fffffffffffff93c);
        in_RDI->params[4].v.data = pLVar4;
      }
      if (((local_10a & 1) != 0) && ((in_RDI->params[3].v.cstep & 1) != 0)) {
        fVar1 = (float)in_RDI->params[3].v.h;
        if (((fVar1 == 0.0) && (!NAN(fVar1))) ||
           ((fVar1 = (float)in_RDI->params[3].v.c, fVar1 == 0.0 && (!NAN(fVar1))))) {
          *(undefined1 *)&in_RDI->params[3].v.cstep = 0;
        }
        else {
          ParamDict::ParamDict(in_RDI);
          ParamDict::set(&local_620,0,(float)in_RDI->params[3].v.h);
          (**(code **)(**(long **)(in_RDI->params + 4) + 0x10))
                    (*(long **)(in_RDI->params + 4),&local_620);
          Mat::Mat(&local_658);
          this_00 = *(Mat **)(in_RDI->params + 4);
          this_01 = (ParamDict *)(in_RDI->params + 2);
          pOVar5 = get_default_option();
          (**(code **)((long)this_00->data + 0x28))(this_00,this_01,&local_658,pOVar5);
          bVar2 = Mat::empty((Mat *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
          if (bVar2) {
            local_4 = -100;
          }
          else {
            Mat::operator=(this_00,(Mat *)CONCAT17(bVar2,in_stack_fffffffffffff940));
          }
          Mat::~Mat((Mat *)0x11d036);
          ParamDict::~ParamDict(this_01);
          if (bVar2) {
            return local_4;
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term)
    {
        weight_data_int8_scale = mb.load(1, 1)[0];
        bottom_blob_int8_scale = mb.load(1, 1)[0];
    }

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        dequantize = ncnn::create_layer(ncnn::LayerType::Dequantize);
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        if (weight_data_int8_scale != 0.f && bottom_blob_int8_scale != 0.f)
        {
            // quantize weight to int8
            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scale);// scale

            quantize->load_param(pd);

            Mat int8_weight_data;
            quantize->forward(weight_data, int8_weight_data);

            if (int8_weight_data.empty())
                return -100;

            weight_data = int8_weight_data;
        }
        else
        {
            // plain float32 weight, fallback to float32 inference
            use_int8_inference = false;
        }
    }

    return 0;
}